

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O2

void __thiscall mdsplit::mdsplitter::remove_auto_toc(mdsplitter *this)

{
  pointer pmVar1;
  string *psVar2;
  bool bVar3;
  ostream *poVar4;
  const_iterator cVar5;
  mdsection *section;
  pointer pmVar6;
  string *str;
  const_iterator __first;
  byte bVar7;
  regex toc_end_regex;
  regex toc_begin_regex;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&toc_begin_regex,
             " *<!-- START doctoc generated TOC please keep comment here to allow auto update --> *"
             ,0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&toc_end_regex,
             " *<!-- END doctoc generated TOC please keep comment here to allow auto update --> *",
             0x10);
  pmVar6 = (this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar1 = (this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pmVar6 == pmVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&toc_end_regex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&toc_begin_regex);
      return;
    }
    psVar2 = (pmVar6->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = 0;
    __first._M_current = psVar2;
    for (str = (pmVar6->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; str != psVar2; str = str + 1) {
      bVar3 = is_codeblock(str);
      bVar7 = bVar7 ^ bVar3;
      cVar5._M_current = __first._M_current;
      if (((bVar7 == 0) &&
          (bVar3 = std::
                   regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                             (str,&toc_begin_regex,0), cVar5._M_current = str, !bVar3)) &&
         (bVar3 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (str,&toc_end_regex,0), cVar5._M_current = __first._M_current, bVar3)) {
        if (str != psVar2 && __first._M_current != psVar2) {
          if (this->trace_ == true) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Found Auto TOC in ");
            poVar4 = std::operator<<(poVar4,(string *)&pmVar6->header_name);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&pmVar6->lines,__first,str + 1);
        }
        break;
      }
      __first._M_current = cVar5._M_current;
    }
    pmVar6 = pmVar6 + 1;
  } while( true );
}

Assistant:

void mdsplitter::remove_auto_toc() {
        std::regex toc_begin_regex{
            R"( *<!-- START doctoc generated TOC please keep comment here to allow auto update --> *)"};
        std::regex toc_end_regex{
            R"( *<!-- END doctoc generated TOC please keep comment here to allow auto update --> *)"};
        for (auto &section : sections_) {
            auto line_it = section.lines.begin();
            auto line_it_end = section.lines.end();
            auto toc_line_it = line_it_end;
            auto toc_line_it_end = line_it_end;
            bool in_codeblock = false;
            for (; line_it != line_it_end; ++line_it) {
                if (is_codeblock(*line_it)) {
                    in_codeblock = 1 - in_codeblock;
                }
                if (in_codeblock) {
                    continue;
                }
                bool found_toc_begin =
                    std::regex_search(*line_it, toc_begin_regex);
                if (found_toc_begin) {
                    toc_line_it = line_it;
                } else {
                    bool found_toc_end =
                        std::regex_search(*line_it, toc_end_regex);
                    if (found_toc_end) {
                        toc_line_it_end = line_it;
                        break;
                    }
                }
            }
            if (toc_line_it != line_it_end && toc_line_it_end != line_it_end) {
                if (trace_) {
                    std::cout << "Found Auto TOC in " << section.header_name
                              << std::endl;
                }
                section.lines.erase(toc_line_it, std::next(toc_line_it_end));
            }
        }
    }